

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

XMLElement * __thiscall tinyxml2::XMLNode::FirstChildElement(XMLNode *this,char *name)

{
  XMLNode *pXVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar5;
  XMLElement *pXVar6;
  long lVar7;
  XMLElement *unaff_R12;
  bool bVar8;
  bool bVar9;
  XMLElement *pXVar4;
  
  pXVar1 = this->_firstChild;
  do {
    if (pXVar1 == (XMLNode *)0x0) {
      return (XMLElement *)0x0;
    }
    iVar3 = (*pXVar1->_vptr_XMLNode[6])(pXVar1);
    pXVar4 = (XMLElement *)CONCAT44(extraout_var,iVar3);
    bVar8 = pXVar4 == (XMLElement *)0x0;
    pXVar6 = pXVar4;
    if (bVar8) {
      pXVar6 = unaff_R12;
    }
    if (name != (char *)0x0 && !bVar8) {
      iVar3 = (*(pXVar4->super_XMLNode)._vptr_XMLNode[9])(pXVar4);
      if (CONCAT44(extraout_var_00,iVar3) == 0) {
        pcVar5 = StrPair::GetStr(&(pXVar4->super_XMLNode)._value);
      }
      else {
        pcVar5 = (char *)0x0;
      }
      if (pcVar5 != name) {
        bVar8 = *pcVar5 == '\0';
        if ((bVar8) || (*pcVar5 != *name)) {
          bVar9 = false;
          pcVar5 = name;
        }
        else {
          lVar2 = 1;
          do {
            lVar7 = lVar2;
            bVar8 = pcVar5[lVar7] == '\0';
            if ((bVar8) || (pcVar5[lVar7] != name[lVar7])) break;
            lVar2 = lVar7 + 1;
          } while ((int)lVar7 != 0x7fffffff);
          bVar9 = (int)lVar7 == 0x7fffffff;
          pcVar5 = name + lVar7;
        }
        if ((!bVar9) && ((!bVar8 || (*pcVar5 != '\0')))) {
          bVar8 = true;
          pXVar6 = unaff_R12;
          goto LAB_0017658e;
        }
      }
      bVar8 = false;
      pXVar6 = pXVar4;
    }
LAB_0017658e:
    if (!bVar8) {
      return pXVar6;
    }
    pXVar1 = pXVar1->_next;
    unaff_R12 = pXVar6;
  } while( true );
}

Assistant:

const XMLElement* XMLNode::FirstChildElement( const char* name ) const
{
    for( const XMLNode* node = _firstChild; node; node = node->_next ) {
        const XMLElement* element = node->ToElement();
        if ( element ) {
            if ( !name || XMLUtil::StringEqual( element->Name(), name ) ) {
                return element;
            }
        }
    }
    return 0;
}